

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildRegisterDefaultCustomRects(ImFontAtlas *atlas)

{
  int iVar1;
  int width;
  
  if (-1 < atlas->CustomRectIds[0]) {
    return;
  }
  if ((atlas->Flags & 2) == 0) {
    width = 0xb5;
    iVar1 = 0x1b;
  }
  else {
    width = 2;
    iVar1 = 2;
  }
  iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0x80000000,width,iVar1);
  atlas->CustomRectIds[0] = iVar1;
  return;
}

Assistant:

void ImFontAtlasBuildRegisterDefaultCustomRects(ImFontAtlas* atlas)
{
    if (atlas->CustomRectIds[0] >= 0)
        return;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_ID, FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF*2+1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
    else
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_ID, 2, 2);
}